

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O3

uint32_t IntegerLog2(uint64_t n)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  
  if (n == 0) {
    return 1;
  }
  if (n == 1) {
    return (uint32_t)((n & n - 1) != 0);
  }
  uVar3 = n - 1;
  if (uVar3 == 0) {
    uVar2 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = (uint)lVar1 ^ 0x3f;
  }
  return 0x40 - uVar2;
}

Assistant:

uint32_t IntegerLog2(uint64_t n) {
  // TODO: Add support for hardware instruction
  uint32_t l = ISPOWOF2(n) ? 0 : 1;
  while (n >>= 1)
    ++l;
  return l;
}